

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> * __thiscall
kj::Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *this)

{
  if (((this->ptr).isSet == true) &&
     ((this->ptr).isSet = false, (this->ptr).field_1.value.tag - 1 < 2)) {
    (this->ptr).field_1.value.tag = 0;
  }
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }